

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O1

void SubtractGreenFromBlueAndRed_SSE2(uint32_t *argb_data,int num_pixels)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int num_pixels_00;
  undefined1 in_XMM1 [16];
  undefined1 auVar6 [16];
  
  uVar4 = 0;
  if (3 < num_pixels) {
    uVar3 = 0;
    do {
      auVar2 = *(undefined1 (*) [16])(argb_data + uVar3);
      auVar6 = pshuflw(in_XMM1,auVar2,0xa0);
      auVar6 = pshufhw(auVar6,auVar6,0xa0);
      in_XMM1._0_2_ = auVar6._0_2_ >> 8;
      in_XMM1._2_2_ = auVar6._2_2_ >> 8;
      in_XMM1._4_2_ = auVar6._4_2_ >> 8;
      in_XMM1._6_2_ = auVar6._6_2_ >> 8;
      in_XMM1._8_2_ = auVar6._8_2_ >> 8;
      in_XMM1._10_2_ = auVar6._10_2_ >> 8;
      in_XMM1._12_2_ = auVar6._12_2_ >> 8;
      in_XMM1._14_2_ = auVar6._14_2_ >> 8;
      puVar1 = argb_data + uVar3;
      *(char *)puVar1 = auVar2[0] - auVar6[1];
      *(char *)((long)puVar1 + 1) = auVar2[1];
      *(char *)((long)puVar1 + 2) = auVar2[2] - auVar6[3];
      *(char *)((long)puVar1 + 3) = auVar2[3];
      *(char *)(puVar1 + 1) = auVar2[4] - auVar6[5];
      *(char *)((long)puVar1 + 5) = auVar2[5];
      *(char *)((long)puVar1 + 6) = auVar2[6] - auVar6[7];
      *(char *)((long)puVar1 + 7) = auVar2[7];
      *(char *)(puVar1 + 2) = auVar2[8] - auVar6[9];
      *(char *)((long)puVar1 + 9) = auVar2[9];
      *(char *)((long)puVar1 + 10) = auVar2[10] - auVar6[0xb];
      *(char *)((long)puVar1 + 0xb) = auVar2[0xb];
      *(char *)(puVar1 + 3) = auVar2[0xc] - auVar6[0xd];
      *(char *)((long)puVar1 + 0xd) = auVar2[0xd];
      *(char *)((long)puVar1 + 0xe) = auVar2[0xe] - auVar6[0xf];
      *(char *)((long)puVar1 + 0xf) = auVar2[0xf];
      uVar4 = uVar3 + 4;
      uVar5 = uVar3 + 8;
      uVar3 = uVar4;
    } while (uVar5 <= (uint)num_pixels);
  }
  num_pixels_00 = num_pixels - (int)uVar4;
  if (num_pixels_00 == 0) {
    return;
  }
  VP8LSubtractGreenFromBlueAndRed_C(argb_data + (uVar4 & 0xffffffff),num_pixels_00);
  return;
}

Assistant:

static void SubtractGreenFromBlueAndRed_SSE2(uint32_t* argb_data,
                                             int num_pixels) {
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i in = _mm_loadu_si128((__m128i*)&argb_data[i]); // argb
    const __m128i A = _mm_srli_epi16(in, 8);     // 0 a 0 g
    const __m128i B = _mm_shufflelo_epi16(A, _MM_SHUFFLE(2, 2, 0, 0));
    const __m128i C = _mm_shufflehi_epi16(B, _MM_SHUFFLE(2, 2, 0, 0));  // 0g0g
    const __m128i out = _mm_sub_epi8(in, C);
    _mm_storeu_si128((__m128i*)&argb_data[i], out);
  }
  // fallthrough and finish off with plain-C
  if (i != num_pixels) {
    VP8LSubtractGreenFromBlueAndRed_C(argb_data + i, num_pixels - i);
  }
}